

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taskschedulertbb.cpp
# Opt level: O0

void embree::TaskScheduler::create(size_t numThreads,bool set_affinity,bool start_threads)

{
  unsigned_long uVar1;
  task_scheduler_observer *value;
  byte in_DL;
  byte in_SIL;
  unsigned_long in_RDI;
  BarrierSys barrier;
  size_t max_concurrency;
  undefined8 in_stack_ffffffffffffffa8;
  undefined1 state;
  anon_class_8_1_6f7ed697 *f;
  task_scheduler_observer *in_stack_ffffffffffffffb0;
  parameter p;
  task_scheduler_observer *in_stack_ffffffffffffffc0;
  anon_class_8_1_6f7ed697 in_stack_ffffffffffffffd0;
  unsigned_long in_stack_ffffffffffffffd8;
  BarrierSys *in_stack_ffffffffffffffe0;
  
  state = (undefined1)((ulong)in_stack_ffffffffffffffa8 >> 0x38);
  if ((g_tbb_threads_initialized & 1) != 0) {
    in_stack_ffffffffffffffc0 = g_tbb_thread_control;
    if (g_tbb_thread_control != (task_scheduler_observer *)0x0) {
      tbb::detail::d1::global_control::~global_control((global_control *)0x1f9a50);
      operator_delete(in_stack_ffffffffffffffc0);
    }
    g_tbb_thread_control = (task_scheduler_observer *)0x0;
    g_tbb_threads_initialized = 0;
  }
  if ((in_SIL & 1) != 0) {
    tbb::detail::d1::task_scheduler_observer::observe(in_stack_ffffffffffffffb0,(bool)state);
  }
  uVar1 = std::numeric_limits<unsigned_long>::max();
  if (in_RDI == uVar1) {
    tbb::detail::d1::max_concurrency();
  }
  else {
    g_tbb_threads_initialized = 1;
    tbb::detail::d1::max_concurrency();
    p = (parameter)(in_RDI >> 0x20);
    value = (task_scheduler_observer *)operator_new(0x18);
    tbb::detail::d1::global_control::global_control
              ((global_control *)in_stack_ffffffffffffffc0,p,(size_t)value);
    g_tbb_thread_control = value;
    in_stack_ffffffffffffffb0 = g_tbb_thread_control;
  }
  if ((in_DL & 1) != 0) {
    f = (anon_class_8_1_6f7ed697 *)&stack0xffffffffffffffd0;
    BarrierSys::BarrierSys(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    tbb::detail::d1::
    parallel_for<unsigned_long,embree::TaskScheduler::create(unsigned_long,bool,bool)::__0>
              ((unsigned_long)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
               (unsigned_long)in_stack_ffffffffffffffd0.barrier,f);
    BarrierSys::~BarrierSys((BarrierSys *)in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

void TaskScheduler::create(size_t numThreads, bool set_affinity, bool start_threads)
  {
    assert(numThreads);

    /* first terminate threads in case we configured them */
    if (g_tbb_threads_initialized) {
#if TBB_INTERFACE_VERSION >= 11005
      delete g_tbb_thread_control;
      g_tbb_thread_control = nullptr;
#else
      g_tbb_threads.terminate();
#endif
      g_tbb_threads_initialized = false;
    }

    /* only set affinity if requested by the user */
#if TBB_INTERFACE_VERSION >= 9000 // affinity not properly supported by older TBB versions
    if (set_affinity)
      tbb_affinity.observe(true);
#endif

    /* now either keep default settings or configure number of threads */
    if (numThreads == std::numeric_limits<size_t>::max()) {
      numThreads = threadCount();
    }
    else {
      g_tbb_threads_initialized = true;
      const size_t max_concurrency = threadCount();
      if (numThreads > max_concurrency) numThreads = max_concurrency;
#if TBB_INTERFACE_VERSION >= 11005
      g_tbb_thread_control = new tbb::global_control(tbb::global_control::max_allowed_parallelism,numThreads);
#else
      g_tbb_threads.initialize(int(numThreads));
#endif
    }

    /* start worker threads */
    if (start_threads)
    {
      BarrierSys barrier(numThreads);
      tbb::parallel_for(size_t(0), size_t(numThreads), size_t(1), [&] ( size_t i ) {
          barrier.wait();
        });
    }
  }